

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

bool duckdb::GetBooleanValue(string *loption,Value *val)

{
  BinderException *this;
  bool bVar1;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (val->is_null != true) {
    bVar1 = BooleanValue::Get(val);
    return bVar1;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"read_csv %s cannot be NULL",&local_59);
  ::std::__cxx11::string::string((string *)&local_58,(string *)loption);
  BinderException::BinderException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool GetBooleanValue(const string &loption, const Value &val) {
	if (val.IsNull()) {
		throw BinderException("read_csv %s cannot be NULL", loption);
	}
	return BooleanValue::Get(val);
}